

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_hmc_multiple_val.cpp
# Opt level: O1

int main(void)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  time_t tVar4;
  ostream *poVar5;
  long lVar6;
  undefined1 *puVar7;
  double *pdVar8;
  int jdim;
  long lVar9;
  int iVar10;
  ulong uVar11;
  double x [3];
  double ham_fin;
  double ham_init;
  double backup_x [3];
  double A [3] [3];
  ofstream outputfile;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  double local_278;
  double local_270;
  double local_268;
  undefined1 local_260 [8];
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_238;
  long local_230;
  filebuf local_228 [16];
  uint auStack_218 [56];
  ios_base local_138 [264];
  
  pdVar3 = &local_270;
  local_278 = 1.0;
  local_258 = 0x4000000000000000;
  local_238 = 0x4000000000000000;
  local_270 = 1.0;
  local_268 = 1.0;
  local_250 = 0x3ff0000000000000;
  lVar6 = 1;
  puVar7 = local_260;
  do {
    lVar9 = 0;
    pdVar8 = pdVar3;
    do {
      *(double *)(puVar7 + lVar9 * 8) = *pdVar8;
      lVar9 = lVar9 + 1;
      pdVar8 = pdVar8 + 3;
    } while (lVar6 != lVar9);
    lVar6 = lVar6 + 1;
    pdVar3 = pdVar3 + 1;
    puVar7 = puVar7 + 0x18;
  } while (lVar6 != 3);
  iVar10 = 0;
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  local_2d8 = 0.0;
  dStack_2d0 = 0.0;
  local_2c8 = 0.0;
  std::ofstream::ofstream(&local_230,"output.txt",_S_out);
  uVar11 = 1;
  do {
    local_288 = local_2c8;
    local_298 = local_2d8;
    dStack_290 = dStack_2d0;
    Molecular_Dynamics((double (*) [3])&local_2d8,(double (*) [3])&local_278,&local_2a0,&local_2a8);
    iVar2 = rand();
    dVar1 = exp(local_2a0 - local_2a8);
    lVar6 = std::cout;
    if (dVar1 <= (double)iVar2 / 2147483647.0) {
      local_2c8 = local_288;
      local_2d8 = local_298;
      dStack_2d0 = dStack_290;
    }
    else {
      iVar10 = iVar10 + 1;
    }
    dVar1 = local_2d8;
    iVar2 = (int)uVar11;
    if ((int)(uVar11 / 10) * -10 + 1 + iVar2 == 1) {
      *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(std::ofstream::close + *(long *)(lVar6 + -0x18)) = 6;
      poVar5 = std::ostream::_M_insert<double>(local_2d8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"   ",3);
      local_2b0 = dStack_2d0;
      poVar5 = std::ostream::_M_insert<double>(dStack_2d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"   ",3);
      local_2b8 = local_2c8;
      poVar5 = std::ostream::_M_insert<double>(local_2c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"   ",3);
      local_2c0 = (double)iVar10 / (double)iVar2;
      poVar5 = std::ostream::_M_insert<double>(local_2c0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
           *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 6;
      poVar5 = std::ostream::_M_insert<double>(dVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"   ",3);
      poVar5 = std::ostream::_M_insert<double>(local_2b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"   ",3);
      poVar5 = std::ostream::_M_insert<double>(local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"   ",3);
      poVar5 = std::ostream::_M_insert<double>(local_2c0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    uVar11 = (ulong)(iVar2 + 1U);
  } while (iVar2 + 1U != 0x2711);
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return 0;
}

Assistant:

int main() {
    double x[ndim];
    double A[ndim][ndim];

    A[0][0] = 1e0;
    A[1][1] = 2e0;
    A[2][2] = 2e0;
    A[0][1] = 1e0;
    A[0][2] = 1e0;
    A[1][2] = 1e0;
    for (int idim = 1; idim < ndim; idim++) {
        for (int jdim = 0; jdim < idim; jdim++) {
            A[idim][jdim] = A[jdim][idim];
        }
    }
    srand((unsigned) time(NULL));

    for (int idim = 0; idim < ndim; idim++) {
        x[idim] = 0e0;
    }

    std::ofstream outputfile("output.txt");
    int naccept = 0;

    for (int iter = 0; iter < niter; iter++) {
        double backup_x[ndim];
        for (int idim = 0; idim < ndim; idim++) {
            backup_x[idim] = x[idim];
        }
        double ham_init, ham_fin;
        Molecular_Dynamics(x, A, ham_init, ham_fin);
        double metropolis = (double) rand() / RAND_MAX;
        if (exp(ham_init - ham_fin) > metropolis) {
            naccept++;
        } else {
            for (int idim = 0; idim < ndim; idim++) {
                x[idim] = backup_x[idim];
            }
        }
        if ((iter + 1) % 10 == 0) {
            std::cout << std::fixed << std::setprecision(6)
                      << x[0] << "   "
                      << x[1] << "   "
                      << x[2] << "   "
                      << ((double) naccept) / ((double) iter + 1)
                      << std::endl;

            outputfile << std::fixed << std::setprecision(6)
                       << x[0] << "   "
                       << x[1] << "   "
                       << x[2] << "   "
                       << ((double) naccept) / ((double) iter + 1)
                       << std::endl;
        }
    }
    outputfile.close();
    return 0;
}